

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtcpsdesinfo.h
# Opt level: O2

void __thiscall jrtplib::RTCPSDESInfo::SDESPrivateItem::~SDESPrivateItem(SDESPrivateItem *this)

{
  ~SDESPrivateItem(this);
  operator_delete(this,0x30);
  return;
}

Assistant:

~SDESPrivateItem()						
		{ 
			if (prefix) 
				RTPDeleteByteArray(prefix,GetMemoryManager());
		}